

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cc
# Opt level: O0

void __thiscall tt::net::HttpData::handleError(HttpData *this,int fd,int err_num,string *short_msg)

{
  char *pcVar1;
  int iVar2;
  unsigned_long __val;
  undefined8 uVar3;
  size_t sVar4;
  string local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1178;
  string local_1158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  string local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  string local_1088 [8];
  string header_buff;
  string body_buff;
  char send_buff [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *short_msg_local;
  int err_num_local;
  int fd_local;
  HttpData *this_local;
  
  local_20 = short_msg;
  short_msg_local._0_4_ = err_num;
  short_msg_local._4_4_ = fd;
  _err_num_local = this;
  std::operator+(&local_40," ",short_msg);
  std::__cxx11::string::operator=((string *)short_msg,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)(header_buff.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_1088);
  std::__cxx11::string::operator+=
            ((string *)(header_buff.field_2._M_local_buf + 8),anon_var_dwarf_24b18);
  std::__cxx11::string::operator+=
            ((string *)(header_buff.field_2._M_local_buf + 8),"<body bgcolor=\"ffffff\">");
  std::__cxx11::to_string(&local_10d8,(int)short_msg_local);
  std::operator+(&local_10b8,&local_10d8,short_msg);
  std::__cxx11::string::operator+=
            ((string *)(header_buff.field_2._M_local_buf + 8),(string *)&local_10b8);
  std::__cxx11::string::~string((string *)&local_10b8);
  std::__cxx11::string::~string((string *)&local_10d8);
  std::__cxx11::string::operator+=
            ((string *)(header_buff.field_2._M_local_buf + 8),
             "<hr><em> LinYa\'s Web Server</em>\n</body></html>");
  std::__cxx11::to_string(&local_1158,(int)short_msg_local);
  std::operator+(&local_1138,"HTTP/1.1 ",&local_1158);
  std::operator+(&local_1118,&local_1138,short_msg);
  std::operator+(&local_10f8,&local_1118,"\r\n");
  std::__cxx11::string::operator+=(local_1088,(string *)&local_10f8);
  std::__cxx11::string::~string((string *)&local_10f8);
  std::__cxx11::string::~string((string *)&local_1118);
  std::__cxx11::string::~string((string *)&local_1138);
  std::__cxx11::string::~string((string *)&local_1158);
  std::__cxx11::string::operator+=(local_1088,"Content-Type: text/html\r\n");
  std::__cxx11::string::operator+=(local_1088,"Connection: Close\r\n");
  __val = std::__cxx11::string::size();
  std::__cxx11::to_string(&local_11b8,__val);
  std::operator+(&local_1198,"Content-Length: ",&local_11b8);
  std::operator+(&local_1178,&local_1198,"\r\n");
  std::__cxx11::string::operator+=(local_1088,(string *)&local_1178);
  std::__cxx11::string::~string((string *)&local_1178);
  std::__cxx11::string::~string((string *)&local_1198);
  std::__cxx11::string::~string((string *)&local_11b8);
  std::__cxx11::string::operator+=(local_1088,"Server: LinYa\'s Web Server\r\n");
  std::__cxx11::string::operator+=(local_1088,"\r\n");
  uVar3 = std::__cxx11::string::c_str();
  pcVar1 = body_buff.field_2._M_local_buf + 8;
  sprintf(pcVar1,"%s",uVar3);
  iVar2 = short_msg_local._4_4_;
  sVar4 = strlen(pcVar1);
  writen(iVar2,pcVar1,sVar4);
  uVar3 = std::__cxx11::string::c_str();
  pcVar1 = body_buff.field_2._M_local_buf + 8;
  sprintf(pcVar1,"%s",uVar3);
  iVar2 = short_msg_local._4_4_;
  sVar4 = strlen(pcVar1);
  writen(iVar2,pcVar1,sVar4);
  std::__cxx11::string::~string(local_1088);
  std::__cxx11::string::~string((string *)(header_buff.field_2._M_local_buf + 8));
  return;
}

Assistant:

void HttpData::handleError(int fd, int err_num, std::string short_msg) {
  short_msg = " " + short_msg;
  char send_buff[4096];
  std::string body_buff, header_buff;
  body_buff += "<html><title>哎~出错了</title>";
  body_buff += "<body bgcolor=\"ffffff\">";
  body_buff += std::to_string(err_num) + short_msg;
  body_buff += "<hr><em> LinYa's Web Server</em>\n</body></html>";

  header_buff += "HTTP/1.1 " + std::to_string(err_num) + short_msg + "\r\n";
  header_buff += "Content-Type: text/html\r\n";
  header_buff += "Connection: Close\r\n";
  header_buff += "Content-Length: " + std::to_string(body_buff.size()) + "\r\n";
  header_buff += "Server: LinYa's Web Server\r\n";
  ;
  header_buff += "\r\n";
  // 错误处理不考虑writen不完的情况
  sprintf(send_buff, "%s", header_buff.c_str());
  writen(fd, send_buff, strlen(send_buff));
  sprintf(send_buff, "%s", body_buff.c_str());
  writen(fd, send_buff, strlen(send_buff));
}